

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O0

void secp256k1_musig_secnonce_invalidate
               (secp256k1_context *ctx,secp256k1_musig_secnonce *secnonce,int flag)

{
  int in_EDX;
  void *in_RSI;
  secp256k1_context *in_RDI;
  
  secp256k1_memczero(in_RSI,0x84,in_EDX);
  secp256k1_declassify(in_RDI,in_RSI,4);
  secp256k1_declassify(in_RDI,(void *)((long)in_RSI + 0x44),0x40);
  return;
}

Assistant:

static void secp256k1_musig_secnonce_invalidate(const secp256k1_context* ctx, secp256k1_musig_secnonce *secnonce, int flag) {
    secp256k1_memczero(secnonce->data, sizeof(secnonce->data), flag);
    /* The flag argument is usually classified. So, the line above makes the
     * magic and public key classified. However, we need both to be
     * declassified. Note that we don't declassify the entire object, because if
     * flag is 0, then k[0] and k[1] have not been zeroed. */
    secp256k1_declassify(ctx, secnonce->data, sizeof(secp256k1_musig_secnonce_magic));
    secp256k1_declassify(ctx, &secnonce->data[68], 64);
}